

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Man_t * Saig_ManWindowInsert(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Aig_Man_t *pWnd)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pWndTest;
  Aig_Man_t *pNew;
  Aig_Man_t *pWnd_local;
  int nDist_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  Aig_ManFanoutStart(p);
  pVVar3 = Saig_ManWindowOutline(p,pObj,nDist);
  pAVar4 = Saig_ManWindowExtractNodes(p,pVVar3);
  iVar1 = Saig_ManPiNum(pAVar4);
  iVar2 = Saig_ManPiNum(pWnd);
  if (iVar1 == iVar2) {
    iVar1 = Saig_ManPoNum(pAVar4);
    iVar2 = Saig_ManPoNum(pWnd);
    if (iVar1 == iVar2) {
      Aig_ManStop(pAVar4);
      Vec_PtrFree(pVVar3);
      Aig_ManCleanData(p);
      pVVar3 = Saig_ManWindowOutline(p,pObj,nDist);
      pAVar4 = Saig_ManWindowInsertNodes(p,pVVar3,pWnd);
      Vec_PtrFree(pVVar3);
      Aig_ManFanoutStop(p);
      return pAVar4;
    }
  }
  printf("The window cannot be reinserted because PI/PO counts do not match.\n");
  Aig_ManStop(pAVar4);
  Vec_PtrFree(pVVar3);
  Aig_ManFanoutStop(p);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManWindowInsert( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Aig_Man_t * pWnd )
{
    Aig_Man_t * pNew, * pWndTest;
    Vec_Ptr_t * vNodes;
    Aig_ManFanoutStart( p );

    vNodes = Saig_ManWindowOutline( p, pObj, nDist );
    pWndTest = Saig_ManWindowExtractNodes( p, vNodes );
    if ( Saig_ManPiNum(pWndTest) != Saig_ManPiNum(pWnd) ||
         Saig_ManPoNum(pWndTest) != Saig_ManPoNum(pWnd) )
    {
        printf( "The window cannot be reinserted because PI/PO counts do not match.\n" );
        Aig_ManStop( pWndTest );
        Vec_PtrFree( vNodes );
        Aig_ManFanoutStop( p );
        return NULL;
    }
    Aig_ManStop( pWndTest );
    Vec_PtrFree( vNodes );

    // insert the nodes
    Aig_ManCleanData( p ); 
    vNodes = Saig_ManWindowOutline( p, pObj, nDist );
    pNew = Saig_ManWindowInsertNodes( p, vNodes, pWnd );
    Vec_PtrFree( vNodes );
    Aig_ManFanoutStop( p );
    return pNew;
}